

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O3

void cmsys::anon_unknown_3::StacktraceSignalHandler(int sigNo,siginfo_t *sigInfo,void *param_3)

{
  __pid_t _Var1;
  uint uVar2;
  ostream *poVar3;
  ostream *poVar4;
  ulong uVar5;
  int wholePath;
  uint *puVar6;
  long lVar7;
  char *pcVar8;
  bool bVar9;
  ostringstream oss;
  string local_1b0;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::ios::widen((char)(ostringstream *)&local_190 + (char)local_190._vptr_basic_ostream[-3]);
  std::ostream::put((char)&local_190);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"=========================================================",0x39);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Process id ",0xb);
  _Var1 = getpid();
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,_Var1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  puVar6 = &switchD_00521ae7::switchdataD_007251f0;
  wholePath = 0x7251f0;
  switch(sigNo) {
  case 2:
    lVar7 = 0xd;
    pcVar8 = "Caught SIGINT";
    break;
  default:
    wholePath = 0x7251f0;
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Caught ",7);
    poVar3 = (ostream *)std::ostream::operator<<(&local_190,sigNo);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," code ",6);
    goto LAB_00521b34;
  case 4:
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Caught SIGILL at ",0x11);
    bVar9 = (sigInfo->_sifields)._sigfault.si_addr == (void *)0x0;
    pcVar8 = "";
    if (bVar9) {
      pcVar8 = "0x";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,pcVar8,(ulong)((uint)bVar9 * 2));
    poVar3 = &local_190;
    poVar4 = std::ostream::_M_insert<void_const*>(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    uVar2 = sigInfo->si_code - 1;
    if (7 < uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"code ",5);
      goto LAB_00521b34;
    }
    uVar5 = (ulong)uVar2;
    pcVar8 = &DAT_00725340 + *(int *)(&DAT_00725340 + uVar5 * 4);
    puVar6 = (uint *)&DAT_00725360;
LAB_00521e5e:
    lVar7 = *(long *)(puVar6 + uVar5 * 2);
    break;
  case 6:
    lVar7 = 0xe;
    pcVar8 = "Caught SIGABRT";
    break;
  case 7:
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Caught SIGBUS at ",0x11);
    bVar9 = (sigInfo->_sifields)._sigfault.si_addr == (void *)0x0;
    pcVar8 = "";
    if (bVar9) {
      pcVar8 = "0x";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,pcVar8,(ulong)((uint)bVar9 * 2));
    poVar3 = &local_190;
    poVar4 = std::ostream::_M_insert<void_const*>(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    uVar2 = sigInfo->si_code - 1;
    if (uVar2 < 5) {
      uVar5 = (ulong)uVar2;
      pcVar8 = &DAT_00725300 + *(int *)(&DAT_00725300 + uVar5 * 4);
      puVar6 = (uint *)&DAT_00725318;
      goto LAB_00521e5e;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"code ",5);
    goto LAB_00521b34;
  case 8:
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Caught SIGFPE at ",0x11);
    bVar9 = (sigInfo->_sifields)._sigfault.si_addr == (void *)0x0;
    pcVar8 = "";
    if (bVar9) {
      pcVar8 = "0x";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,pcVar8,(ulong)((uint)bVar9 * 2));
    poVar3 = &local_190;
    poVar4 = std::ostream::_M_insert<void_const*>(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    uVar2 = sigInfo->si_code - 1;
    if (uVar2 < 8) {
      uVar5 = (ulong)uVar2;
      pcVar8 = &DAT_0072529c + *(int *)(&DAT_0072529c + uVar5 * 4);
      puVar6 = (uint *)&DAT_007252c0;
      goto LAB_00521e5e;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"code ",5);
LAB_00521b34:
    std::ostream::operator<<(poVar3,sigInfo->si_code);
    goto LAB_00521c81;
  case 0xb:
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,"Caught SIGSEGV at ",0x12);
    bVar9 = (sigInfo->_sifields)._sigfault.si_addr == (void *)0x0;
    pcVar8 = "";
    if (bVar9) {
      pcVar8 = "0x";
    }
    std::__ostream_insert<char,std::char_traits<char>>(&local_190,pcVar8,(ulong)((uint)bVar9 * 2));
    poVar3 = &local_190;
    poVar4 = std::ostream::_M_insert<void_const*>(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
    wholePath = (int)puVar6;
    if (sigInfo->si_code == 1) {
      lVar7 = 0x1c;
      pcVar8 = "address not mapped to object";
    }
    else {
      if (sigInfo->si_code != 2) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"code ",5);
        goto LAB_00521b34;
      }
      lVar7 = 0x24;
      pcVar8 = "invalid permission for mapped object";
    }
    break;
  case 0xf:
    lVar7 = 0xe;
    pcVar8 = "Caught SIGTERM";
  }
  wholePath = (int)puVar6;
  std::__ostream_insert<char,std::char_traits<char>>(&local_190,pcVar8,lVar7);
LAB_00521c81:
  poVar3 = std::endl<char,std::char_traits<char>>(&local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Program Stack:",0xe);
  poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
  SystemInformationImplementation::GetProgramStack_abi_cxx11_
            (&local_1b0,(SystemInformationImplementation *)0x2,0,wholePath);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"=========================================================",0x39);
  std::endl<char,std::char_traits<char>>(poVar3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar3);
  std::__cxx11::string::~string((string *)&local_1b0);
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
}

Assistant:

void StacktraceSignalHandler(int sigNo, siginfo_t* sigInfo,
                             void* /*sigContext*/)
{
#  if defined(__linux) || defined(__APPLE__)
  std::ostringstream oss;
  oss << std::endl
      << "========================================================="
      << std::endl
      << "Process id " << getpid() << " ";
  switch (sigNo) {
    case SIGINT:
      oss << "Caught SIGINT";
      break;

    case SIGTERM:
      oss << "Caught SIGTERM";
      break;

    case SIGABRT:
      oss << "Caught SIGABRT";
      break;

    case SIGFPE:
      oss << "Caught SIGFPE at " << (sigInfo->si_addr == nullptr ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
#    if defined(FPE_INTDIV)
        case FPE_INTDIV:
          oss << "integer division by zero";
          break;
#    endif

#    if defined(FPE_INTOVF)
        case FPE_INTOVF:
          oss << "integer overflow";
          break;
#    endif

        case FPE_FLTDIV:
          oss << "floating point divide by zero";
          break;

        case FPE_FLTOVF:
          oss << "floating point overflow";
          break;

        case FPE_FLTUND:
          oss << "floating point underflow";
          break;

        case FPE_FLTRES:
          oss << "floating point inexact result";
          break;

        case FPE_FLTINV:
          oss << "floating point invalid operation";
          break;

#    if defined(FPE_FLTSUB)
        case FPE_FLTSUB:
          oss << "floating point subscript out of range";
          break;
#    endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGSEGV:
      oss << "Caught SIGSEGV at " << (sigInfo->si_addr == nullptr ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case SEGV_MAPERR:
          oss << "address not mapped to object";
          break;

        case SEGV_ACCERR:
          oss << "invalid permission for mapped object";
          break;

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGBUS:
      oss << "Caught SIGBUS at " << (sigInfo->si_addr == nullptr ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case BUS_ADRALN:
          oss << "invalid address alignment";
          break;

#    if defined(BUS_ADRERR)
        case BUS_ADRERR:
          oss << "nonexistent physical address";
          break;
#    endif

#    if defined(BUS_OBJERR)
        case BUS_OBJERR:
          oss << "object-specific hardware error";
          break;
#    endif

#    if defined(BUS_MCEERR_AR)
        case BUS_MCEERR_AR:
          oss << "Hardware memory error consumed on a machine check; action "
                 "required.";
          break;
#    endif

#    if defined(BUS_MCEERR_AO)
        case BUS_MCEERR_AO:
          oss << "Hardware memory error detected in process but not consumed; "
                 "action optional.";
          break;
#    endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    case SIGILL:
      oss << "Caught SIGILL at " << (sigInfo->si_addr == nullptr ? "0x" : "")
          << sigInfo->si_addr << " ";
      switch (sigInfo->si_code) {
        case ILL_ILLOPC:
          oss << "illegal opcode";
          break;

#    if defined(ILL_ILLOPN)
        case ILL_ILLOPN:
          oss << "illegal operand";
          break;
#    endif

#    if defined(ILL_ILLADR)
        case ILL_ILLADR:
          oss << "illegal addressing mode.";
          break;
#    endif

        case ILL_ILLTRP:
          oss << "illegal trap";
          break;

        case ILL_PRVOPC:
          oss << "privileged opcode";
          break;

#    if defined(ILL_PRVREG)
        case ILL_PRVREG:
          oss << "privileged register";
          break;
#    endif

#    if defined(ILL_COPROC)
        case ILL_COPROC:
          oss << "co-processor error";
          break;
#    endif

#    if defined(ILL_BADSTK)
        case ILL_BADSTK:
          oss << "internal stack error";
          break;
#    endif

        default:
          oss << "code " << sigInfo->si_code;
          break;
      }
      break;

    default:
      oss << "Caught " << sigNo << " code " << sigInfo->si_code;
      break;
  }
  oss << std::endl
      << "Program Stack:" << std::endl
      << SystemInformationImplementation::GetProgramStack(2, 0)
      << "========================================================="
      << std::endl;
  std::cerr << oss.str() << std::endl;

  // restore the previously registered handlers
  // and abort
  SystemInformationImplementation::SetStackTraceOnError(0);
  abort();
#  else
  // avoid warning C4100
  (void)sigNo;
  (void)sigInfo;
#  endif
}